

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeMemoryReportFormatter.cpp
# Opt level: O2

bool __thiscall
CodeMemoryReportFormatter::variableExists
          (CodeMemoryReportFormatter *this,SimpleString *variableName)

{
  CodeReportingAllocationNode *otherBuffer;
  bool bVar1;
  CodeReportingAllocationNode **ppCVar2;
  SimpleString local_30;
  
  ppCVar2 = &this->codeReportingList_;
  do {
    otherBuffer = *ppCVar2;
    if (otherBuffer == (CodeReportingAllocationNode *)0x0) break;
    SimpleString::SimpleString(&local_30,otherBuffer->variableName_);
    bVar1 = operator==(variableName,&local_30);
    SimpleString::~SimpleString(&local_30);
    ppCVar2 = &otherBuffer->next_;
  } while (!bVar1);
  return otherBuffer != (CodeReportingAllocationNode *)0x0;
}

Assistant:

bool CodeMemoryReportFormatter::variableExists(const SimpleString& variableName)
{
    CodeReportingAllocationNode* current = codeReportingList_;
    while (current) {
        if (variableName == current->variableName_)
            return true;
        current = current->next_;
    }
    return false;
}